

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::optional<nonius::run_configuration>::destroy(optional<nonius::run_configuration> *this)

{
  if (this->initialized == true) {
    run_configuration::~run_configuration((run_configuration *)this);
    this->initialized = false;
  }
  return;
}

Assistant:

void destroy() {
            if (initialized) {
                get_impl().~T();
                initialized = false;
            }
        }